

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O1

void __thiscall
llbuild::basic::appendShellEscapedString(basic *this,raw_ostream *os,StringRef string)

{
  byte bVar1;
  byte *__n;
  StringRef Str;
  StringRef Str_00;
  size_type From;
  char *pcVar2;
  raw_ostream *this_00;
  char *pcVar3;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *__buf;
  size_t idx;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  string escQuote;
  StringRef local_50;
  long *local_40 [2];
  long local_30 [2];
  
  local_50.Length = (size_t)string.Data;
  local_50.Data = (char *)os;
  if (appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_ == '\0') {
    appendShellEscapedString();
  }
  Chars.Length = appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_.
                 _M_string_length;
  Chars.Data = appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_.
               _M_dataplus._M_p;
  From = llvm::StringRef::find_first_not_of(&local_50,Chars,0);
  if (From == 0xffffffffffffffff) {
    Str.Length = local_50.Length;
    Str.Data = local_50.Data;
    llvm::raw_ostream::operator<<((raw_ostream *)this,Str);
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\'","");
    Chars_00.Length = 1;
    Chars_00.Data = "\'";
    pcVar2 = (char *)llvm::StringRef::find_first_of(&local_50,Chars_00,From);
    Str_01.Length = 1;
    Str_01.Data = "\'";
    this_00 = llvm::raw_ostream::operator<<((raw_ostream *)this,Str_01);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      Str_00.Length = local_50.Length;
      Str_00.Data = local_50.Data;
      this = (basic *)llvm::raw_ostream::operator<<(this_00,Str_00);
    }
    else {
      pcVar3 = pcVar2;
      if (local_50.Length < pcVar2) {
        pcVar3 = (char *)local_50.Length;
      }
      Str_02.Length = (size_t)pcVar3;
      Str_02.Data = local_50.Data;
      llvm::raw_ostream::operator<<((raw_ostream *)this,Str_02);
      __buf = extraout_RDX;
      if (pcVar2 < local_50.Length) {
        do {
          bVar1 = pcVar2[(long)(_func_int ***)local_50.Data];
          if (bVar1 == 0x27) {
            Str_03.Length = 4;
            Str_03.Data = "\'\\\'\'";
            llvm::raw_ostream::operator<<((raw_ostream *)this,Str_03);
            __buf = extraout_RDX_00;
          }
          else {
            __n = *(byte **)(this + 0x18);
            if (__n < *(byte **)(this + 0x10)) {
              __buf = __n + 1;
              *(byte **)(this + 0x18) = __buf;
              *__n = bVar1;
            }
            else {
              llvm::raw_ostream::write((raw_ostream *)this,(uint)bVar1,__buf,(size_t)__n);
              __buf = extraout_RDX_01;
            }
          }
          pcVar2 = pcVar2 + 1;
        } while (pcVar2 < local_50.Length);
      }
    }
    Str_04.Length = 1;
    Str_04.Data = "\'";
    llvm::raw_ostream::operator<<((raw_ostream *)this,Str_04);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void appendShellEscapedString(llvm::raw_ostream& os, StringRef string) {
#if defined(_WIN32)
  os << formatWindowsCommandArg(string);
  return;
#else
  static const std::string whitelist = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ1234567890-_/:@#%+=.,";
  auto pos = string.find_first_not_of(whitelist);

  // We don't need any escaping just append the string and return.
  if (pos == std::string::npos) {
    os << string;
    return;
  }

  std::string escQuote = "'";
  // We only need to escape the single quote, if it isn't present we can
  // escape using single quotes.
  auto singleQuotePos = string.find_first_of("'" , pos);
  if (singleQuotePos == std::string::npos) {
    os << "'" << string << "'";
    return;
  }

  // Otherwise iterate and escape all the single quotes.
  os << "'";
  os << string.slice(0, singleQuotePos);
  for (auto idx = singleQuotePos; idx < string.size(); idx++) {
    if (string[idx] == '\'') {
      os << "'\\''";
    } else {
      os << string[idx];
    }
  }
  os << "'";
#endif
}